

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void append_honorific(char *buf)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar1 = mt_random();
  strcat(buf,append_honorific_honored_rel +
             *(int *)(append_honorific_honored_rel +
                     ((uVar1 & 3) + (uint)(((uint)u.uevent >> 0xd & 1) != 0)) * 4));
  if (((youmonst.data)->mlet != '0') && (uVar1 = (youmonst.data)->mflags2, (uVar1 >> 8 & 1) == 0)) {
    if ((uVar1 & 0x10) == 0) {
      if ((uVar1 & 8) == 0) {
        sVar2 = strlen(buf);
        builtin_strncpy(buf + sVar2," creature",10);
        return;
      }
      pcVar3 = " sir";
      pcVar4 = " lady";
    }
    else {
      pcVar3 = " hir";
      pcVar4 = " hiril";
    }
    if (flags.female == '\0') {
      pcVar4 = pcVar3;
    }
    strcat(buf,pcVar4);
    return;
  }
  pcVar4 = " dark lady";
  if (flags.female == '\0') {
    pcVar4 = " dark lord";
  }
  sVar2 = strlen(buf);
  *(undefined8 *)(buf + sVar2) = *(undefined8 *)pcVar4;
  *(undefined4 *)(buf + sVar2 + 7) = *(undefined4 *)(pcVar4 + 7);
  return;
}

Assistant:

static void append_honorific(char *buf)
{
	static const char *const honored[5] = {
	    "good", "honored", "most gracious", "esteemed",
	    "most renowned and sacred"
	};
	strcat(buf, honored[rn2(4) + u.uevent.udemigod]);

	if (is_vampire(youmonst.data))
	    strcat(buf, flags.female ? " dark lady" : " dark lord");
	else if (is_elf(youmonst.data))
	    strcat(buf, flags.female ? " hiril" : " hir");
	else if (!is_human(youmonst.data))
	    strcat(buf, " creature");
	else
	    strcat(buf, flags.female ? " lady" : " sir");
}